

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O3

void __thiscall pstack::MmapReader::MmapReader(MmapReader *this,Context *c,string *name_)

{
  int __fd;
  char *pcVar1;
  Exception *this_00;
  int *piVar2;
  Exception *rhs;
  undefined1 local_258 [8];
  stat s;
  char *local_28;
  
  MemReader::MemReader(&this->super_MemReader,name_,0,(char *)0x0);
  (this->super_MemReader).super_Reader._vptr_Reader = (_func_int **)&PTR__MmapReader_0017b838;
  __fd = Context::openfile(c,name_,0,0x1ff);
  memset((stat64 *)local_258,0,0x90);
  fstat64(__fd,(stat64 *)local_258);
  (this->super_MemReader).len = s.st_rdev;
  pcVar1 = (char *)mmap64((void *)0x0,s.st_rdev,1,2,__fd,0);
  close(__fd);
  if (pcVar1 != (char *)0xffffffffffffffff) {
    (this->super_MemReader).data = pcVar1;
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x1a0);
  memset((Exception *)(s.__glibc_reserved + 2),0,0x1a0);
  Exception::Exception((Exception *)(s.__glibc_reserved + 2));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&stack0xfffffffffffffe40,"mmap failed: ",0xd);
  piVar2 = __errno_location();
  local_28 = strerror(*piVar2);
  rhs = Exception::operator<<((Exception *)(s.__glibc_reserved + 2),&local_28);
  Exception::Exception(this_00,rhs);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

MmapReader::MmapReader(Context &c, const string &name_)
   : MemReader(name_, 0, nullptr)
{
   int fd = c.openfile(name_);
   struct stat s{};
   fstat(fd, &s);
   len = s.st_size;
   void *p = mmap(nullptr, len, PROT_READ, MAP_PRIVATE, fd, 0);
   close(fd);
   if (p == MAP_FAILED)
      throw (Exception() << "mmap failed: " << strerror(errno));
   data = static_cast<char *>(p);
}